

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_bytedata.cpp
# Opt level: O3

uint32_t __thiscall cfd::core::Deserializer::ReadUint32FromBigEndian(Deserializer *this)

{
  uint uVar1;
  pointer puVar2;
  uint uVar3;
  
  CheckReadSize(this,4);
  if (IsBigEndian()::is_big_endian == (undefined1 *)0x0) {
    IsBigEndian()::is_big_endian = &IsBigEndian()::kFalse;
  }
  puVar2 = (this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_start;
  uVar1 = this->offset_;
  if (IsBigEndian()::kFalse == '\x01') {
    uVar3 = *(uint *)(puVar2 + uVar1);
  }
  else {
    uVar3 = *(uint *)(puVar2 + uVar1);
    uVar3 = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
  }
  this->offset_ = uVar1 + 4;
  return uVar3;
}

Assistant:

uint32_t Deserializer::ReadUint32FromBigEndian() {
  uint32_t result = 0;
  CheckReadSize(sizeof(result));
  if (IsBigEndian()) {
    memcpy(&result, &buffer_.data()[offset_], sizeof(result));
  } else {
    uint8_t tmp_buf[4];
    memcpy(tmp_buf, &buffer_.data()[offset_], sizeof(tmp_buf));
    result = static_cast<uint32_t>(tmp_buf[3] & 0x000000ff) +
             static_cast<uint32_t>((tmp_buf[2] << 8) & 0x0000ff00) +
             static_cast<uint32_t>((tmp_buf[1] << 16) & 0x00ff0000) +
             static_cast<uint32_t>((tmp_buf[0] << 24) & 0xff000000);
  }
  offset_ += sizeof(result);
  return result;
}